

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)20>_> *
vkt::api::anon_unknown_1::Sampler::create
          (Move<vk::Handle<(vk::HandleType)20>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  undefined1 local_78 [8];
  VkSamplerCreateInfo samplerInfo;
  Parameters *params_local;
  Resources *param_1_local;
  Environment *env_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  samplerInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  samplerInfo._4_4_ = 0;
  samplerInfo.pNext._0_4_ = 0;
  samplerInfo.pNext._4_4_ = params->magFilter;
  samplerInfo.flags = params->minFilter;
  samplerInfo.magFilter = params->mipmapMode;
  samplerInfo.minFilter = params->addressModeU;
  samplerInfo.mipmapMode = params->addressModeV;
  samplerInfo.addressModeU = params->addressModeW;
  samplerInfo.addressModeV = (VkSamplerAddressMode)params->mipLodBias;
  samplerInfo.addressModeW = params->anisotropyEnable;
  samplerInfo.mipLodBias = params->maxAnisotropy;
  samplerInfo.anisotropyEnable = params->compareEnable;
  samplerInfo.maxAnisotropy = (float)params->compareOp;
  samplerInfo.compareEnable = (VkBool32)params->minLod;
  samplerInfo.compareOp = (VkCompareOp)params->maxLod;
  samplerInfo.minLod = (float)params->borderColor;
  samplerInfo.maxLod = (float)params->unnormalizedCoordinates;
  samplerInfo._72_8_ = params;
  ::vk::createSampler(__return_storage_ptr__,env->vkd,env->device,(VkSamplerCreateInfo *)local_78,
                      env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkSampler> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkSamplerCreateInfo	samplerInfo	=
		{
			VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
			DE_NULL,
			(VkSamplerCreateFlags)0,
			params.magFilter,
			params.minFilter,
			params.mipmapMode,
			params.addressModeU,
			params.addressModeV,
			params.addressModeW,
			params.mipLodBias,
			params.anisotropyEnable,
			params.maxAnisotropy,
			params.compareEnable,
			params.compareOp,
			params.minLod,
			params.maxLod,
			params.borderColor,
			params.unnormalizedCoordinates
		};

		return createSampler(env.vkd, env.device, &samplerInfo, env.allocationCallbacks);
	}